

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

void __thiscall
polyscope::TransformationGizmo::TransformationGizmo
          (TransformationGizmo *this,string *name_,mat4 *T_,
          PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *Tpers_)

{
  undefined1 auVar1 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  Widget::Widget(&this->super_Widget);
  (this->super_Widget)._vptr_Widget = (_func_int **)&PTR_draw_0047cbd0;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  std::operator+(&bStack_48,&this->name,"#name");
  PersistentValue<bool>::PersistentValue(&this->enabled,&bStack_48,false);
  std::__cxx11::string::~string((string *)&bStack_48);
  this->T = T_;
  this->Tpers = Tpers_;
  this->gizmoSizeRel = 0.08;
  this->diskWidthObj = 0.1;
  this->vecLength = 1.5;
  this->sphereRad = 0.32;
  this->selectedDim = -1;
  this->selectedType = None;
  this->currentlyDragging = false;
  (this->dragPrevVec).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  (this->dragPrevVec).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  *(undefined8 *)&(this->dragPrevVec).field_2 = 0x3f53d3d400000000;
  (this->niceRGB)._M_elems[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3e34b4b5;
  (this->niceRGB)._M_elems[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3e78f8f9;
  (this->niceRGB)._M_elems[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3e828283;
  (this->niceRGB)._M_elems[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3ef2f2f3;
  *(undefined8 *)&(this->niceRGB)._M_elems[1].field_2 = 0x3ebebebf3f61e1e2;
  (this->niceRGB)._M_elems[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f2fafb0;
  (this->niceRGB)._M_elems[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3e0c8c8d;
  auVar1 = ZEXT832(0) << 0x20;
  this->ringProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._0_16_;
  this->arrowProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._16_16_;
  this->arrowProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._0_16_;
  this->sphereProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._16_16_;
  return;
}

Assistant:

TransformationGizmo::TransformationGizmo(std::string name_, glm::mat4& T_, PersistentValue<glm::mat4>* Tpers_)
    : name(name_), enabled(name + "#name", false), T(T_), Tpers(Tpers_)

{}